

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::MultiVertexArrayStrideTests::addStrideCases
          (MultiVertexArrayStrideTests *this,Spec *spec,int depth)

{
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  Spec *this_01;
  long lVar2;
  GLValue GVar3;
  GLValue GVar4;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  string desc;
  string name;
  Spec local_58;
  
  if (depth == 0) {
    this_01 = spec;
    getTestName_abi_cxx11_(&name,(MultiVertexArrayStrideTests *)spec,spec);
    getTestName_abi_cxx11_(&desc,(MultiVertexArrayStrideTests *)this_01,spec);
    this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
    deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
              (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,spec,name._M_dataplus._M_p,
               desc._M_dataplus._M_p);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
  }
  else {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      if (lVar2 == 4) {
        iVar1 = deqp::gls::Array::inputTypeSize(INPUTTYPE_FLOAT);
        iVar1 = iVar1 * 2;
      }
      else {
        iVar1 = *(int *)((long)&DAT_0181a310 + lVar2);
      }
      GVar3 = deqp::gls::GLValue::getMinValue(INPUTTYPE_FLOAT);
      GVar4 = deqp::gls::GLValue::getMaxValue(INPUTTYPE_FLOAT);
      max_._4_4_ = uStack_dc;
      max_.type = GVar4.type;
      min_._4_4_ = uStack_cc;
      min_.type = GVar3.type;
      min_.field_1 = GVar3.field_1;
      max_.field_1 = GVar4.field_1;
      deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                ((ArraySpec *)&name,INPUTTYPE_FLOAT,OUTPUTTYPE_VEC2,STORAGE_USER,USAGE_DYNAMIC_DRAW,
                 2,0,iVar1,false,min_,max_);
      deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)&desc,spec);
      std::
      vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                   *)&desc.field_2,(ArraySpec *)&name);
      deqp::gls::MultiVertexArrayTest::Spec::Spec(&local_58,(Spec *)&desc);
      addStrideCases(this,&local_58,depth + -1);
      std::
      _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::~_Vector_base(&local_58.arrays.
                       super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                     );
      std::
      _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::~_Vector_base((_Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       *)&desc.field_2);
    }
  }
  return;
}

Assistant:

void MultiVertexArrayStrideTests::addStrideCases (MultiVertexArrayTest::Spec spec, int depth)
{
	if (depth == 0)
	{
		std::string name = getTestName(spec);
		std::string desc = getTestName(spec);
		addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), desc.c_str()));
		return;
	}

	int strides[]	= {0, -1, 17, 32};

	for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
	{
		const int componentCount = 2;
		MultiVertexArrayTest::Spec::ArraySpec arraySpec(Array::INPUTTYPE_FLOAT,
														Array::OUTPUTTYPE_VEC2,
														Array::STORAGE_USER,
														Array::USAGE_DYNAMIC_DRAW,
														componentCount,
														0,
														(strides[strideNdx] >= 0 ? strides[strideNdx] : componentCount * Array::inputTypeSize(Array::INPUTTYPE_FLOAT)),
														false,
														GLValue::getMinValue(Array::INPUTTYPE_FLOAT),
														GLValue::getMaxValue(Array::INPUTTYPE_FLOAT));

		MultiVertexArrayTest::Spec _spec = spec;
		_spec.arrays.push_back(arraySpec);
		addStrideCases(_spec, depth-1);
	}
}